

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_InterpBndryData.cpp
# Opt level: O2

void __thiscall
amrex::InterpBndryData::setBndryValues
          (InterpBndryData *this,MultiFab *mf,int mf_start,int bnd_start,int num_comp,
          IntVect *ref_ratio,BCRec *bc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  FArrayBox *pFVar7;
  FArrayBox *pFVar8;
  double *pdVar9;
  double *pdVar10;
  Box *pBVar11;
  undefined8 uVar12;
  int k;
  ulong uVar13;
  int *piVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  int n;
  uint uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  Box lhs;
  undefined1 local_ac [4];
  int local_a8;
  int local_a4 [5];
  MFIter mfi;
  
  for (uVar28 = bnd_start; (int)uVar28 < num_comp + bnd_start; uVar28 = uVar28 + 1) {
    (*(this->super_BndryData).super_BndryRegister._vptr_BndryRegister[3])
              (this,bc,ref_ratio,(ulong)uVar28);
  }
  local_ac[0] = false;
  local_ac[1] = true;
  local_ac[2] = true;
  local_a8 = Gpu::Device::max_gpu_streams;
  local_a4[0] = 0;
  local_a4[1] = 0;
  local_a4[2] = 0;
  MFIter::MFIter(&mfi,(FabArrayBase *)mf,(MFItInfo *)local_ac);
  uVar33 = (ulong)(uint)num_comp;
  if (num_comp < 1) {
    uVar33 = 0;
  }
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::validbox((Box *)local_ac,&mfi);
    for (uVar26 = 0; uVar26 != 6; uVar26 = uVar26 + 1) {
      uVar19 = (uVar26 & 0xffffffff) % 3;
      uVar13 = (ulong)(uint)((int)uVar19 * 4);
      piVar14 = (int *)local_ac;
      if (2 < uVar26) {
        piVar14 = local_a4 + 1;
      }
      pBVar11 = (Box *)&(this->super_BndryData).geom.domain.bigend;
      if (2 >= uVar26) {
        pBVar11 = &(this->super_BndryData).geom.domain;
      }
      if ((*(int *)((long)piVar14 + uVar13) == *(int *)((long)(pBVar11->smallend).vect + uVar13)) &&
         (*(char *)((long)(this->super_BndryData).geom.super_CoordSys.inv_dx + uVar19 + 0x19) ==
          '\0')) {
        piVar14 = &mfi.currentIndex;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar14 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + mfi.currentIndex;
        }
        pFVar7 = (this->super_BndryData).super_BndryRegister.bndry[uVar26].m_mf.
                 super_FabArray<amrex::FArrayBox>.m_fabs_v.
                 super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl
                 .super__Vector_impl_data._M_start[*piVar14];
        pFVar8 = (mf->super_FabArray<amrex::FArrayBox>).m_fabs_v.
                 super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl
                 .super__Vector_impl_data._M_start[*piVar14];
        pdVar9 = (pFVar7->super_BaseFab<double>).dptr;
        iVar1 = (pFVar7->super_BaseFab<double>).domain.smallend.vect[0];
        iVar2 = (pFVar7->super_BaseFab<double>).domain.smallend.vect[1];
        iVar3 = (pFVar7->super_BaseFab<double>).domain.smallend.vect[2];
        lVar35 = (long)(((pFVar7->super_BaseFab<double>).domain.bigend.vect[0] - iVar1) + 1);
        lVar20 = (long)(((pFVar7->super_BaseFab<double>).domain.bigend.vect[1] - iVar2) + 1);
        lVar16 = (long)(((pFVar7->super_BaseFab<double>).domain.bigend.vect[2] - iVar3) + 1);
        pdVar10 = (pFVar8->super_BaseFab<double>).dptr;
        iVar4 = (pFVar8->super_BaseFab<double>).domain.smallend.vect[0];
        iVar5 = (pFVar8->super_BaseFab<double>).domain.smallend.vect[1];
        iVar6 = (pFVar8->super_BaseFab<double>).domain.smallend.vect[2];
        lhs.smallend.vect._0_8_ =
             *(undefined8 *)(pFVar8->super_BaseFab<double>).domain.smallend.vect;
        uVar12 = *(undefined8 *)((pFVar8->super_BaseFab<double>).domain.smallend.vect + 2);
        lhs._20_8_ = *(undefined8 *)((pFVar8->super_BaseFab<double>).domain.bigend.vect + 2);
        lVar34 = (long)(((pFVar8->super_BaseFab<double>).domain.bigend.vect[0] - iVar4) + 1);
        lVar31 = (long)(((pFVar8->super_BaseFab<double>).domain.bigend.vect[1] - iVar5) + 1);
        lVar29 = (long)(((pFVar8->super_BaseFab<double>).domain.bigend.vect[2] - iVar6) + 1);
        lhs.bigend.vect[1] =
             (int)((ulong)*(undefined8 *)(pFVar8->super_BaseFab<double>).domain.bigend.vect >> 0x20)
        ;
        lhs.smallend.vect[2] = (int)uVar12;
        lhs.bigend.vect[0] = (int)((ulong)uVar12 >> 0x20);
        Box::operator&=(&lhs,&(pFVar7->super_BaseFab<double>).domain);
        lVar17 = (long)lhs.smallend.vect[2];
        lVar24 = (long)lhs.smallend.vect[1];
        lVar22 = (((long)mf_start * 8 * lVar29 + lVar17 * 8 + (long)iVar6 * -8) * lVar31 +
                  lVar24 * 8 + (long)iVar5 * -8) * lVar34 + (long)lhs.smallend.vect[0] * 8 +
                 (long)iVar4 * -8 + (long)pdVar10;
        lVar32 = lVar31 * lVar34 * 8;
        lVar31 = (((long)bnd_start * 8 * lVar16 + lVar17 * 8 + (long)iVar3 * -8) * lVar20 +
                  lVar24 * 8 + (long)iVar2 * -8) * lVar35 + (long)lhs.smallend.vect[0] * 8 +
                 (long)iVar1 * -8 + (long)pdVar9;
        lVar20 = lVar20 * lVar35 * 8;
        for (uVar19 = 0; lVar15 = lVar17, lVar21 = lVar31, lVar23 = lVar22, uVar19 != uVar33;
            uVar19 = uVar19 + 1) {
          for (; lVar18 = lVar24, lVar25 = lVar23, lVar27 = lVar21, lVar15 <= lhs.bigend.vect[2];
              lVar15 = lVar15 + 1) {
            for (; lVar18 <= lhs.bigend.vect[1]; lVar18 = lVar18 + 1) {
              if (lhs.smallend.vect[0] <= lhs.bigend.vect[0]) {
                lVar30 = 0;
                do {
                  *(undefined8 *)(lVar27 + lVar30 * 8) = *(undefined8 *)(lVar25 + lVar30 * 8);
                  lVar30 = lVar30 + 1;
                } while ((lhs.bigend.vect[0] - lhs.smallend.vect[0]) + 1 != (int)lVar30);
              }
              lVar25 = lVar25 + lVar34 * 8;
              lVar27 = lVar27 + lVar35 * 8;
            }
            lVar23 = lVar23 + lVar32;
            lVar21 = lVar21 + lVar20;
          }
          lVar22 = lVar22 + lVar29 * lVar32;
          lVar31 = lVar31 + lVar16 * lVar20;
        }
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
InterpBndryData::setBndryValues (const MultiFab& mf,
                                 int             mf_start,
                                 int             bnd_start,
                                 int             num_comp,
                                 const IntVect&  ref_ratio,
                                 const BCRec&    bc)
{
    //
    // Check that boxarrays are identical.
    //
    BL_ASSERT(grids.size());
    BL_ASSERT(grids == mf.boxArray());

    for (int n = bnd_start; n < bnd_start+num_comp; ++n) {
        setBndryConds(bc, ref_ratio, n);
    }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf,MFItInfo().SetDynamic(true)); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.validbox();

        for (OrientationIter fi; fi; ++fi)
        {
            const Orientation face = fi();

            if (bx[face]==geom.Domain()[face] && !geom.isPeriodic(face.coordDir()))
            {
                //
                // Physical bndry, copy from grid.
                //
                auto& bnd_fab = bndry[face][mfi];
                auto const& src_fab = mf[mfi];
                auto bnd_array = bnd_fab.array();
                auto const src_array = src_fab.array();
                const Box& b = src_fab.box() & bnd_fab.box();
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( b, num_comp, i, j, k, n,
                {
                    bnd_array(i,j,k,n+bnd_start) = src_array(i,j,k,n+mf_start);
                });
            }
        }
    }
}